

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.c
# Opt level: O2

int GetResidualCost_C(int ctx0,VP8Residual *res)

{
  byte bVar1;
  ushort uVar2;
  ProbaArray *paauVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint8_t (*pauVar8) [11];
  uint16_t *puVar9;
  ushort uVar10;
  CostArrayPtr papuVar11;
  
  lVar6 = (long)res->first;
  paauVar3 = res->prob;
  bVar1 = paauVar3[lVar6][ctx0][0];
  uVar4 = 0;
  if (ctx0 == 0) {
    uVar4 = (uint)VP8EntropyCost[(byte)~bVar1];
  }
  if ((long)res->last < 0) {
    uVar4 = (uint)VP8EntropyCost[bVar1];
  }
  else {
    puVar9 = res->costs[lVar6][ctx0];
    lVar7 = lVar6 << 0x20;
    papuVar11 = res->costs + lVar6;
    while (papuVar11 = papuVar11 + 1, lVar6 < res->last) {
      uVar2 = res->coeffs[lVar6];
      uVar10 = -uVar2;
      if (0 < (short)uVar2) {
        uVar10 = uVar2;
      }
      uVar5 = 0x43;
      if (uVar10 < 0x43) {
        uVar5 = (uint)uVar10;
      }
      uVar4 = uVar4 + VP8LevelFixedCosts[uVar10] + (uint)puVar9[uVar5];
      lVar6 = lVar6 + 1;
      uVar5 = 2;
      if (uVar10 < 2) {
        uVar5 = (uint)uVar10;
      }
      puVar9 = (*papuVar11)[uVar5];
      lVar7 = lVar7 + 0x100000000;
    }
    uVar2 = *(ushort *)((long)res->coeffs + (lVar7 >> 0x1f));
    uVar10 = -uVar2;
    if (0 < (short)uVar2) {
      uVar10 = uVar2;
    }
    uVar5 = 0x43;
    if (uVar10 < 0x43) {
      uVar5 = (uint)uVar10;
    }
    uVar4 = uVar4 + VP8LevelFixedCosts[uVar10] + (uint)puVar9[uVar5];
    if (lVar6 < 0xf) {
      pauVar8 = *paauVar3 + 1;
      if (uVar10 != 1) {
        pauVar8 = *paauVar3 + 2;
      }
      uVar4 = uVar4 + VP8EntropyCost[pauVar8[(ulong)""[lVar7 + 0x100000000 >> 0x20] * 3][0]];
    }
  }
  return uVar4;
}

Assistant:

static int GetResidualCost_C(int ctx0, const VP8Residual* const res) {
  int n = res->first;
  // should be prob[VP8EncBands[n]], but it's equivalent for n=0 or 1
  const int p0 = res->prob[n][ctx0][0];
  CostArrayPtr const costs = res->costs;
  const uint16_t* t = costs[n][ctx0];
  // bit_cost(1, p0) is already incorporated in t[] tables, but only if ctx != 0
  // (as required by the syntax). For ctx0 == 0, we need to add it here or it'll
  // be missing during the loop.
  int cost = (ctx0 == 0) ? VP8BitCost(1, p0) : 0;

  if (res->last < 0) {
    return VP8BitCost(0, p0);
  }
  for (; n < res->last; ++n) {
    const int v = abs(res->coeffs[n]);
    const int ctx = (v >= 2) ? 2 : v;
    cost += VP8LevelCost(t, v);
    t = costs[n + 1][ctx];
  }
  // Last coefficient is always non-zero
  {
    const int v = abs(res->coeffs[n]);
    assert(v != 0);
    cost += VP8LevelCost(t, v);
    if (n < 15) {
      const int b = VP8EncBands[n + 1];
      const int ctx = (v == 1) ? 1 : 2;
      const int last_p0 = res->prob[b][ctx][0];
      cost += VP8BitCost(0, last_p0);
    }
  }
  return cost;
}